

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::TestTexture::TestTexture
          (TestTexture *this,CompressedTexFormat *format,int width,int height,int depth)

{
  int depth_local;
  int height_local;
  int width_local;
  CompressedTexFormat *format_local;
  TestTexture *this_local;
  
  this->_vptr_TestTexture = (_func_int **)&PTR__TestTexture_016a4298;
  std::vector<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>::vector
            (&this->m_compressedLevels);
  return;
}

Assistant:

TestTexture::TestTexture (const tcu::CompressedTexFormat& format, int width, int height, int depth)
{
	DE_ASSERT(width >= 1);
	DE_ASSERT(height >= 1);
	DE_ASSERT(depth >= 1);

	DE_UNREF(format);
	DE_UNREF(width);
	DE_UNREF(height);
	DE_UNREF(depth);
}